

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serialize-text.c++
# Opt level: O2

void __thiscall capnp::TextCodec::decode(TextCodec *this,StringPtr input,Builder output)

{
  Builder result;
  Builder builder;
  Reader assignments;
  undefined8 uVar1;
  BuilderArena *pBVar2;
  StringPtr message;
  Orphanage orphanageParam;
  IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
  IVar3;
  ArrayPtr<const_char> input_00;
  Fault f;
  ThrowingErrorReporter errorReporter;
  ParserInput parserInput;
  ExternalResolver nullResolver;
  ThrowingErrorReporter errorReporter_1;
  ValueTranslator translator;
  Reader local_3b8;
  Reader local_388;
  NullableValue<capnp::Orphan<capnp::compiler::Expression>_> expression;
  Builder lexedTokens;
  Reader local_308;
  Reader tokens;
  MallocMessageBuilder tokenArena;
  CapnpParser parser;
  
  errorReporter.super_ErrorReporter._vptr_ErrorReporter = (ErrorReporter)&PTR_addError_00309460;
  MallocMessageBuilder::MallocMessageBuilder(&tokenArena,0x400,GROW_HEURISTICALLY);
  MessageBuilder::initRoot<capnp::compiler::LexedTokens>
            (&lexedTokens,&tokenArena.super_MessageBuilder);
  result._builder.capTable = lexedTokens._builder.capTable;
  result._builder.segment = lexedTokens._builder.segment;
  result._builder.data = lexedTokens._builder.data;
  result._builder.pointers = lexedTokens._builder.pointers;
  result._builder.dataSize = lexedTokens._builder.dataSize;
  result._builder.pointerCount = lexedTokens._builder.pointerCount;
  result._builder._38_2_ = lexedTokens._builder._38_2_;
  input_00.size_ = input.content.size_ - 1;
  input_00.ptr = input.content.ptr;
  capnp::compiler::lex(input_00,result,&errorReporter.super_ErrorReporter);
  orphanageParam = MessageBuilder::getOrphanage(&tokenArena.super_MessageBuilder);
  capnp::compiler::CapnpParser::CapnpParser
            (&parser,orphanageParam,&errorReporter.super_ErrorReporter);
  capnp::_::StructBuilder::asReader(&lexedTokens._builder);
  capnp::compiler::LexedTokens::Reader::getTokens(&tokens,(Reader *)&parserInput);
  parserInput.parent =
       (IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
        *)0x0;
  parserInput.pos.index = 0;
  parserInput.end.index = tokens.reader.elementCount;
  parserInput.best.index = 0;
  parserInput.pos.container = &tokens;
  parserInput.end.container = &tokens;
  parserInput.best.container = &tokens;
  if (tokens.reader.elementCount == 0) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[22]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
               ,0x57,FAILED,(char *)0x0,"\"Failed to read input.\"",
               (char (*) [22])"Failed to read input.");
    kj::_::Debug::Fault::fatal(&f);
  }
  (*(code *)**(undefined8 **)parser.parsers.expression.wrapper)
            (&f,parser.parsers.expression.wrapper,parser.parsers.expression.parser);
  kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::NullableValue
            (&expression,(NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *)&f);
  kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::~NullableValue
            ((NullableValue<capnp::Orphan<capnp::compiler::Expression>_> *)&f);
  if (expression.isSet == true) {
    if (parserInput.pos.index != tokens.reader.elementCount) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[23]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x4b,FAILED,"parserInput.getPosition() == tokens.end()",
                 "\"Extra tokens in input.\"",(char (*) [23])"Extra tokens in input.");
      kj::_::Debug::Fault::fatal(&f);
    }
    capnp::_::OrphanGetImpl<capnp::compiler::Expression,_(capnp::Kind)3>::applyReader
              (&local_308,&expression.field_1.value.builder);
    local_388._reader.dataSize = local_308._reader.dataSize;
    local_388._reader.pointerCount = local_308._reader.pointerCount;
    local_388._reader._38_2_ = local_308._reader._38_2_;
    uVar1 = local_388._reader._32_8_;
    local_388._reader.nestingLimit = local_308._reader.nestingLimit;
    local_388._reader._44_4_ = local_308._reader._44_4_;
    local_388._reader.segment = local_308._reader.segment;
    local_388._reader.capTable = local_308._reader.capTable;
    local_388._reader.data = local_308._reader.data;
    local_388._reader.pointers = local_308._reader.pointers;
    local_388._reader.dataSize = local_308._reader.dataSize;
    local_388._reader._32_8_ = uVar1;
    if ((local_388._reader.dataSize < 0x10) || (*local_308._reader.data != 7)) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x74,FAILED,"expression.isTuple()","\"Input does not contain a struct.\"",
                 (char (*) [33])"Input does not contain a struct.");
      kj::_::Debug::Fault::fatal(&f);
    }
    errorReporter_1.super_ErrorReporter._vptr_ErrorReporter = (ErrorReporter)&PTR_addError_00309460;
    nullResolver.super_Resolver._vptr_Resolver = (Resolver)&PTR_resolveConstant_00309498;
    f.exception = (Exception *)output.builder.segment;
    pBVar2 = capnp::_::StructBuilder::getArena((StructBuilder *)&f);
    translator.orphanage.capTable = capnp::_::StructBuilder::getCapTable((StructBuilder *)&f);
    translator.resolver = &nullResolver.super_Resolver;
    translator.errorReporter = &errorReporter_1.super_ErrorReporter;
    f.exception = (Exception *)output.schema.super_Schema.raw;
    translator.orphanage.arena = pBVar2;
    capnp::compiler::Expression::Reader::getTuple(&local_3b8,&local_388);
    assignments.reader.capTable._4_4_ = local_3b8.reader.capTable._4_4_;
    assignments.reader.capTable._0_4_ = (uint)local_3b8.reader.capTable;
    builder.builder.segment = output.builder.segment;
    builder.schema.super_Schema.raw = (Schema)(Schema)f.exception;
    builder.builder.capTable = output.builder.capTable;
    builder.builder.data = output.builder.data;
    builder.builder.pointers = output.builder.pointers;
    builder.builder.dataSize = output.builder.dataSize;
    builder.builder.pointerCount = output.builder.pointerCount;
    builder.builder._38_2_ = output.builder._38_2_;
    assignments.reader.segment = local_3b8.reader.segment;
    assignments.reader.ptr = local_3b8.reader.ptr;
    assignments.reader.elementCount = local_3b8.reader.elementCount;
    assignments.reader.step = local_3b8.reader.step;
    assignments.reader.structDataSize = local_3b8.reader.structDataSize;
    assignments.reader.structPointerCount = local_3b8.reader.structPointerCount;
    assignments.reader.elementSize = local_3b8.reader.elementSize;
    assignments.reader._39_1_ = local_3b8.reader._39_1_;
    assignments.reader.nestingLimit = local_3b8.reader.nestingLimit;
    assignments.reader._44_4_ = local_3b8.reader._44_4_;
    capnp::compiler::ValueTranslator::fillStructValue(&translator,builder,assignments);
  }
  else {
    IVar3 = kj::parse::
            IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
            ::getBest(&parserInput);
    local_3b8.reader.segment = (SegmentReader *)IVar3.container;
    local_3b8.reader.capTable._0_4_ = IVar3.index;
    if ((uint)local_3b8.reader.capTable == tokens.reader.elementCount) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[24]>
                (&f,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/serialize-text.c++"
                 ,0x51,FAILED,(char *)0x0,"\"Premature end of input.\"",
                 (char (*) [24])"Premature end of input.");
      kj::_::Debug::Fault::fatal(&f);
    }
    capnp::_::
    IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
    ::operator*((Reader *)&f,
                (IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>
                 *)&local_3b8);
    message.content.size_ = 0xc;
    message.content.ptr = "Parse error";
    capnp::compiler::ErrorReporter::addErrorOn<capnp::compiler::Token::Reader>
              (&errorReporter.super_ErrorReporter,(Reader *)&f,message);
  }
  kj::_::NullableValue<capnp::Orphan<capnp::compiler::Expression>_>::~NullableValue(&expression);
  kj::parse::
  IteratorInput<capnp::compiler::Token::Reader,_capnp::_::IndexingIterator<const_capnp::List<capnp::compiler::Token,_(capnp::Kind)3>::Reader,_capnp::compiler::Token::Reader>_>
  ::~IteratorInput(&parserInput);
  capnp::compiler::CapnpParser::~CapnpParser(&parser);
  MallocMessageBuilder::~MallocMessageBuilder(&tokenArena);
  return;
}

Assistant:

void TextCodec::decode(kj::StringPtr input, DynamicStruct::Builder output) const {
  lexAndParseExpression(input, [&output](compiler::Expression::Reader expression) {
    KJ_REQUIRE(expression.isTuple(), "Input does not contain a struct.");

    ThrowingErrorReporter errorReporter;
    ExternalResolver nullResolver;

    Orphanage orphanage = Orphanage::getForMessageContaining(output);
    compiler::ValueTranslator translator(nullResolver, errorReporter, orphanage);
    translator.fillStructValue(output, expression.getTuple());
  });
}